

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

void __thiscall BVSparse<Memory::JitArenaAllocator>::Dump(BVSparse<Memory::JitArenaAllocator> *this)

{
  bool hasBits;
  
  hasBits = false;
  Output::Print(L"[ ");
  while (this = (BVSparse<Memory::JitArenaAllocator> *)this->head,
        this != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    hasBits = BVUnitT<unsigned_long>::Dump
                        ((Type *)&this->alloc,*(BVIndex *)&this->lastFoundIndex,hasBits);
  }
  Output::Print(L"]\n");
  return;
}

Assistant:

void
BVSparse<TAllocator>::Dump() const
{
    bool hasBits = false;
    Output::Print(_u("[ "));
    for(BVSparseNode * node = this->head; node != 0 ; node = node->next)
    {
        hasBits = node->data.Dump(node->startIndex, hasBits);
    }
    Output::Print(_u("]\n"));
}